

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O2

bool creat_daemon(string *name,bool to_null)

{
  bool bVar1;
  int iVar2;
  __pid_t pid;
  char *fmt;
  string *psVar3;
  bool bVar4;
  string pid_file_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  psVar3 = &pid_file_;
  DAT_0010a4e4 = 2;
  if (name->_M_string_length == 0) {
    zpsoe::zlog::_print_log
              (LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fifilyu[P]CommandBridge/src/common.cxx"
               ,0x4f,"The daemon name is invalid.");
    return false;
  }
  std::operator+(&local_38,"/var/run/",name);
  std::operator+(&pid_file_,&local_38,".pid");
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = is_exist(&pid_file_);
  if (bVar1) {
    bVar4 = false;
    zpsoe::zlog::_print_log
              (LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fifilyu[P]CommandBridge/src/common.cxx"
               ,0x56,"%s exists.",pid_file_._M_dataplus._M_p);
  }
  else {
    iVar2 = daemon(0,(uint)!to_null);
    if (iVar2 == 0) {
      pid = getpid();
      bVar1 = crt_pid_file(pid,&pid_file_);
      bVar4 = true;
      if (bVar1) goto LAB_00105501;
      fmt = "Cannot create pid file \'%s\'.";
      iVar2 = 99;
    }
    else {
      fmt = "Cannot run %s in the background as system daemons.";
      iVar2 = 0x5d;
      psVar3 = name;
    }
    bVar4 = false;
    zpsoe::zlog::_print_log
              (LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fifilyu[P]CommandBridge/src/common.cxx"
               ,iVar2,fmt,(psVar3->_M_dataplus)._M_p);
  }
LAB_00105501:
  std::__cxx11::string::~string((string *)&pid_file_);
  return bVar4;
}

Assistant:

bool creat_daemon(const std::string &name, const bool to_null) {
    G_LogConfig.output_to = LOGOUTPUTSTREAM_STDERR;

    if (name.empty()) {
        print_log(LOG_ERROR, "The daemon name is invalid.");
        return false;
    }

    const std::string pid_file_("/var/run/" + name + ".pid");

    if (is_exist(pid_file_)) {
        print_log(LOG_ERROR, "%s exists.", pid_file_.c_str());
        return false;
    }

    const int noclose_(to_null ? 0 : 1);

    if (daemon(0, noclose_) != 0) {
        print_log(LOG_ERROR, "Cannot run %s in the background as system daemons.", name.c_str());
        return false;
    }

    // 在执行daemon函数之后获取的pid才是实际的子进程pid
    if (!crt_pid_file(getpid(), pid_file_)) {
        print_log(LOG_ERROR, "Cannot create pid file '%s'.", pid_file_.c_str());
        return false;
    }

    return true;
}